

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::IdentityTessellationShaderCase::iterate
          (IdentityTessellationShaderCase *this)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestLog *pTVar8;
  ProgramSources *pPVar9;
  TestError *pTVar10;
  RenderTarget *this_00;
  Vector<int,_3> local_56c;
  Vector<unsigned_int,_4> local_560;
  ConstPixelBufferAccess local_550;
  ConstPixelBufferAccess local_528;
  ConstPixelBufferAccess local_500;
  ConstPixelBufferAccess local_4d8;
  bool local_4ab;
  undefined1 local_4aa;
  allocator<char> local_4a9;
  undefined1 local_4a8 [5];
  bool imageOk;
  undefined1 local_482;
  allocator<char> local_481;
  string local_480;
  int local_45c;
  undefined1 local_458 [4];
  int posLocation;
  VertexArray vao;
  ShaderProgram program;
  ShaderSource local_350;
  string local_328;
  ShaderSource local_308;
  string local_2e0;
  ShaderSource local_2c0;
  string local_298;
  ShaderSource local_278;
  string local_250;
  ShaderSource local_230;
  undefined1 local_208 [8];
  ProgramSources sources;
  string local_130;
  allocator<char> local_109;
  string local_108;
  ScopedLogSection local_e8;
  ScopedLogSection section;
  int renderNdx;
  anon_struct_64_4_50fb60c7 renderTargets [2];
  int numPrimitiveVertices;
  undefined1 local_48 [8];
  Surface resultWithoutTessellation;
  Surface resultWithTessellation;
  Functions *gl;
  IdentityTessellationShaderCase *this_local;
  long lVar7;
  
  pRVar6 = gles31::Context::getRenderContext
                     ((this->super_IdentityShaderCase).super_TestCase.m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  tcu::Surface::Surface((Surface *)&resultWithoutTessellation.m_pixels.m_cap,0x100,0x100);
  tcu::Surface::Surface((Surface *)local_48,0x100,0x100);
  renderTargets[1].surfaceAccess.super_ConstPixelBufferAccess.m_data._0_4_ =
       (this->m_case == CASE_TRIANGLES) + 2;
  renderTargets[0].name = "Render with tessellation shader";
  renderTargets[0].description._0_1_ = 1;
  tcu::Surface::getAccess
            ((PixelBufferAccess *)&renderTargets[0].containsTessellationShaders,
             (Surface *)&resultWithoutTessellation.m_pixels.m_cap);
  renderTargets[0].surfaceAccess.super_ConstPixelBufferAccess.m_data = anon_var_dwarf_1c4355c;
  renderTargets[1].name = "Render without tessellation shader";
  renderTargets[1].description._0_1_ = 0;
  tcu::Surface::getAccess
            ((PixelBufferAccess *)&renderTargets[1].containsTessellationShaders,(Surface *)local_48)
  ;
  (**(code **)(lVar7 + 0x1a00))(0,0,0x100);
  (**(code **)(lVar7 + 0x1c0))(0,0,0,0x3f800000);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"set viewport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x225);
  (**(code **)(lVar7 + 0x5e0))(0xbe2);
  (**(code **)(lVar7 + 0x120))(0x302,1);
  (**(code **)(lVar7 + 0x100))(0x8006);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"set blend",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x22a);
  section.m_log._4_4_ = 0;
  while( true ) {
    if (1 < section.m_log._4_4_) {
      this_00 = gles31::Context::getRenderTarget
                          ((this->super_IdentityShaderCase).super_TestCase.m_context);
      iVar4 = tcu::RenderTarget::getNumSamples(this_00);
      if (iVar4 < 2) {
        pTVar8 = tcu::TestContext::getLog
                           ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::Surface::getAccess((PixelBufferAccess *)&local_528,(Surface *)local_48);
        tcu::Surface::getAccess
                  ((PixelBufferAccess *)&local_550,
                   (Surface *)&resultWithoutTessellation.m_pixels.m_cap);
        tcu::Vector<unsigned_int,_4>::Vector(&local_560,8,8,8,0xff);
        tcu::Vector<int,_3>::Vector(&local_56c,1,1,0);
        local_4ab = tcu::intThresholdPositionDeviationCompare
                              (pTVar8,"ImageCompare","Image comparison",&local_528,&local_550,
                               &local_560,&local_56c,true,COMPARE_LOG_RESULT);
      }
      else {
        pTVar8 = tcu::TestContext::getLog
                           ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::Surface::getAccess((PixelBufferAccess *)&local_4d8,(Surface *)local_48);
        tcu::Surface::getAccess
                  ((PixelBufferAccess *)&local_500,
                   (Surface *)&resultWithoutTessellation.m_pixels.m_cap);
        local_4ab = tcu::fuzzyCompare(pTVar8,"ImageCompare","Image comparison",&local_4d8,&local_500
                                      ,0.03,COMPARE_LOG_RESULT);
      }
      if (local_4ab == false) {
        tcu::TestContext::setTestResult
                  ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Image comparison failed");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      }
      tcu::Surface::~Surface((Surface *)local_48);
      tcu::Surface::~Surface((Surface *)&resultWithoutTessellation.m_pixels.m_cap);
      return STOP;
    }
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    pcVar1 = (char *)renderTargets[(long)section.m_log._4_4_ + -1].surfaceAccess.
                     super_ConstPixelBufferAccess.m_data;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,pcVar1,&local_109);
    pcVar1 = renderTargets[section.m_log._4_4_].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,pcVar1,(allocator<char> *)&sources.field_0xcf);
    tcu::ScopedLogSection::ScopedLogSection(&local_e8,pTVar8,&local_108,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)&sources.field_0xcf);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    glu::ProgramSources::ProgramSources((ProgramSources *)local_208);
    Functional::(anonymous_namespace)::IdentityShaderCase::getVertexSource_abi_cxx11_
              (&local_250,this);
    glu::VertexSource::VertexSource((VertexSource *)&local_230,&local_250);
    pPVar9 = glu::ProgramSources::operator<<((ProgramSources *)local_208,&local_230);
    Functional::(anonymous_namespace)::IdentityShaderCase::getFragmentSource_abi_cxx11_
              (&local_298,this);
    glu::FragmentSource::FragmentSource((FragmentSource *)&local_278,&local_298);
    pPVar9 = glu::ProgramSources::operator<<(pPVar9,&local_278);
    Functional::(anonymous_namespace)::IdentityTessellationShaderCase::getGeometrySource_abi_cxx11_
              (&local_2e0,this,(bool)(*(byte *)&renderTargets[section.m_log._4_4_].description & 1))
    ;
    glu::GeometrySource::GeometrySource((GeometrySource *)&local_2c0,&local_2e0);
    glu::ProgramSources::operator<<(pPVar9,&local_2c0);
    glu::GeometrySource::~GeometrySource((GeometrySource *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
    glu::FragmentSource::~FragmentSource((FragmentSource *)&local_278);
    std::__cxx11::string::~string((string *)&local_298);
    glu::VertexSource::~VertexSource((VertexSource *)&local_230);
    std::__cxx11::string::~string((string *)&local_250);
    if (((ulong)renderTargets[section.m_log._4_4_].description & 1) != 0) {
      Functional::(anonymous_namespace)::IdentityTessellationShaderCase::
      getTessellationControlSource_abi_cxx11_(&local_328,this);
      glu::TessellationControlSource::TessellationControlSource
                ((TessellationControlSource *)&local_308,&local_328);
      pPVar9 = glu::ProgramSources::operator<<((ProgramSources *)local_208,&local_308);
      Functional::(anonymous_namespace)::IdentityTessellationShaderCase::
      getTessellationEvaluationSource_abi_cxx11_
                ((string *)&program.m_program.m_info.linkTimeUs,this);
      glu::TessellationEvaluationSource::TessellationEvaluationSource
                ((TessellationEvaluationSource *)&local_350,
                 (string *)&program.m_program.m_info.linkTimeUs);
      glu::ProgramSources::operator<<(pPVar9,&local_350);
      glu::TessellationEvaluationSource::~TessellationEvaluationSource
                ((TessellationEvaluationSource *)&local_350);
      std::__cxx11::string::~string((string *)&program.m_program.m_info.linkTimeUs);
      glu::TessellationControlSource::~TessellationControlSource
                ((TessellationControlSource *)&local_308);
      std::__cxx11::string::~string((string *)&local_328);
    }
    pRVar6 = gles31::Context::getRenderContext
                       ((this->super_IdentityShaderCase).super_TestCase.m_context);
    glu::ShaderProgram::ShaderProgram
              ((ShaderProgram *)&vao.super_ObjectWrapper.m_object,pRVar6,(ProgramSources *)local_208
              );
    pRVar6 = gles31::Context::getRenderContext
                       ((this->super_IdentityShaderCase).super_TestCase.m_context);
    glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)5> *)local_458,pRVar6);
    pcVar2 = *(code **)(lVar7 + 0x780);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)&vao.super_ObjectWrapper.m_object);
    local_45c = (*pcVar2)(dVar5,"a_position");
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    glu::operator<<(pTVar8,(ShaderProgram *)&vao.super_ObjectWrapper.m_object);
    bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)&vao.super_ObjectWrapper.m_object);
    if (!bVar3) break;
    if (local_45c == -1) {
      local_4aa = 1;
      pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_4a8,"a_position location was -1",&local_4a9);
      tcu::TestError::TestError(pTVar10,(string *)local_4a8);
      local_4aa = 0;
      __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    pcVar2 = *(code **)(lVar7 + 0xd8);
    dVar5 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_458);
    (*pcVar2)(dVar5);
    (**(code **)(lVar7 + 0x40))(0x8892,this->m_dataBuffer);
    (**(code **)(lVar7 + 0x19f0))(local_45c,4,0x1406,0,0,0);
    (**(code **)(lVar7 + 0x610))(local_45c);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"setup attribs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x24a);
    pcVar2 = *(code **)(lVar7 + 0x1680);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)&vao.super_ObjectWrapper.m_object);
    (*pcVar2)(dVar5);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"use program",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x24d);
    (**(code **)(lVar7 + 0x188))(0x4000);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"clear",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x250);
    if (((ulong)renderTargets[section.m_log._4_4_].description & 1) == 0) {
      (**(code **)(lVar7 + 0x538))
                ((this->m_case == CASE_TRIANGLES) * '\x03' + '\x01',0,
                 (int)renderTargets[1].surfaceAccess.super_ConstPixelBufferAccess.m_data);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"draw primitives",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                      ,0x25d);
    }
    else {
      (**(code **)(lVar7 + 0xfd8))
                (0x8e72,(int)renderTargets[1].surfaceAccess.super_ConstPixelBufferAccess.m_data);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"set patch param",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                      ,0x255);
      (**(code **)(lVar7 + 0x538))
                (0xe,0,(int)renderTargets[1].surfaceAccess.super_ConstPixelBufferAccess.m_data);
      dVar5 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar5,"draw patches",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                      ,600);
    }
    pRVar6 = gles31::Context::getRenderContext
                       ((this->super_IdentityShaderCase).super_TestCase.m_context);
    glu::readPixels(pRVar6,0,0,
                    (PixelBufferAccess *)
                    &renderTargets[section.m_log._4_4_].containsTessellationShaders);
    glu::TypedObjectWrapper<(glu::ObjectType)5>::~TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)5> *)local_458);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&vao.super_ObjectWrapper.m_object);
    glu::ProgramSources::~ProgramSources((ProgramSources *)local_208);
    tcu::ScopedLogSection::~ScopedLogSection(&local_e8);
    section.m_log._4_4_ = section.m_log._4_4_ + 1;
  }
  local_482 = 1;
  pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_480,"could not build program",&local_481);
  tcu::TestError::TestError(pTVar10,&local_480);
  local_482 = 0;
  __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IdentityTessellationShaderCase::IterateResult IdentityTessellationShaderCase::iterate (void)
{
	const glw::Functions&	gl							= m_context.getRenderContext().getFunctions();
	tcu::Surface			resultWithTessellation		(RENDER_SIZE, RENDER_SIZE);
	tcu::Surface			resultWithoutTessellation	(RENDER_SIZE, RENDER_SIZE);
	const int				numPrimitiveVertices		= (m_case == CASE_TRIANGLES) ? (3) : (2);

	const struct
	{
		const char*				name;
		const char*				description;
		bool					containsTessellationShaders;
		tcu::PixelBufferAccess	surfaceAccess;
	} renderTargets[] =
	{
		{ "RenderWithTessellationShader",		"Render with tessellation shader",		true,	resultWithTessellation.getAccess()		},
		{ "RenderWithoutTessellationShader",	"Render without tessellation shader",	false,	resultWithoutTessellation.getAccess()	},
	};

	gl.viewport(0, 0, RENDER_SIZE, RENDER_SIZE);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "set viewport");

	gl.enable(GL_BLEND);
	gl.blendFunc(GL_SRC_ALPHA, GL_ONE);
	gl.blendEquation(GL_FUNC_ADD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "set blend");

	// render with and without tessellation shader
	for (int renderNdx = 0; renderNdx < DE_LENGTH_OF_ARRAY(renderTargets); ++renderNdx)
	{
		const tcu::ScopedLogSection	section	(m_testCtx.getLog(), renderTargets[renderNdx].name, renderTargets[renderNdx].description);
		glu::ProgramSources			sources;

		sources	<< glu::VertexSource(getVertexSource())
				<< glu::FragmentSource(getFragmentSource())
				<< glu::GeometrySource(getGeometrySource(renderTargets[renderNdx].containsTessellationShaders));

		if (renderTargets[renderNdx].containsTessellationShaders)
			sources	<< glu::TessellationControlSource(getTessellationControlSource())
					<< glu::TessellationEvaluationSource(getTessellationEvaluationSource());

		{
			const glu::ShaderProgram	program					(m_context.getRenderContext(), sources);
			const glu::VertexArray		vao						(m_context.getRenderContext());
			const int					posLocation				= gl.getAttribLocation(program.getProgram(), "a_position");

			m_testCtx.getLog() << program;

			if (!program.isOk())
				throw tcu::TestError("could not build program");
			if (posLocation == -1)
				throw tcu::TestError("a_position location was -1");

			gl.bindVertexArray(*vao);
			gl.bindBuffer(GL_ARRAY_BUFFER, m_dataBuffer);
			gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
			gl.enableVertexAttribArray(posLocation);
			GLU_EXPECT_NO_ERROR(gl.getError(), "setup attribs");

			gl.useProgram(program.getProgram());
			GLU_EXPECT_NO_ERROR(gl.getError(), "use program");

			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

			if (renderTargets[renderNdx].containsTessellationShaders)
			{
				gl.patchParameteri(GL_PATCH_VERTICES, numPrimitiveVertices);
				GLU_EXPECT_NO_ERROR(gl.getError(), "set patch param");

				gl.drawArrays(GL_PATCHES, 0, numPrimitiveVertices);
				GLU_EXPECT_NO_ERROR(gl.getError(), "draw patches");
			}
			else
			{
				gl.drawArrays((m_case == CASE_TRIANGLES) ? (GL_TRIANGLES) : (GL_LINES), 0, numPrimitiveVertices);
				GLU_EXPECT_NO_ERROR(gl.getError(), "draw primitives");
			}

			glu::readPixels(m_context.getRenderContext(), 0, 0, renderTargets[renderNdx].surfaceAccess);
		}
	}

	// compare
	{
		bool imageOk;

		if (m_context.getRenderTarget().getNumSamples() > 1)
			imageOk = tcu::fuzzyCompare(m_testCtx.getLog(),
										"ImageCompare",
										"Image comparison",
										resultWithoutTessellation.getAccess(),
										resultWithTessellation.getAccess(),
										0.03f,
										tcu::COMPARE_LOG_RESULT);
		else
			imageOk = tcu::intThresholdPositionDeviationCompare(m_testCtx.getLog(),
																"ImageCompare",
																"Image comparison",
																resultWithoutTessellation.getAccess(),
																resultWithTessellation.getAccess(),
																tcu::UVec4(8, 8, 8, 255),				//!< threshold
																tcu::IVec3(1, 1, 0),					//!< 3x3 search kernel
																true,									//!< fragments may end up over the viewport, just ignore them
																tcu::COMPARE_LOG_RESULT);

		if (imageOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}

	return STOP;
}